

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-htable.c
# Opt level: O2

ulong hash_func(char *param_1)

{
  ulong uVar1;
  byte *pbVar2;
  
  uVar1 = 0;
  for (pbVar2 = *(byte **)(param_1 + 8); *pbVar2 != 0; pbVar2 = pbVar2 + 1) {
    uVar1 = (ulong)(((uint)uVar1 ^ (uint)*pbVar2) * 0x1000193);
  }
  return uVar1;
}

Assistant:

static uint32_t
hash_func(const HTABLE_NODE* node)
{
    /* FNV-1a */
    static const uint32_t FNV1A_PRIME_32 = 16777619;
    VAL* val = (VAL*) HTABLE_DATA(node, VAL, the_node);
    const uint8_t* ptr = (const uint8_t*) val->key;
    uint32_t fnv1a = 0;

    while(*ptr) {
        fnv1a ^= *ptr;
        fnv1a *= FNV1A_PRIME_32;
        ptr++;
    }

    return fnv1a;
}